

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

int __thiscall QtMWidgets::TextLabelPrivate::init(TextLabelPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QPalette *this_00;
  QColor *pQVar3;
  QWidget aQStack_38 [8];
  uint local_30 [6];
  
  QStaticText::setTextFormat((TextFormat)&this->staticText);
  QTextOption::QTextOption((QTextOption *)local_30);
  local_30[1] = 0x80000000;
  local_30[0] = local_30[0] & 0xffffe000 | 0x201;
  QStaticText::setTextOption((QTextOption *)&this->staticText);
  QWidget::fontMetrics(aQStack_38);
  iVar2 = QFontMetrics::averageCharWidth();
  QStaticText::setTextWidth((double)(iVar2 * 10));
  QFontMetrics::~QFontMetrics((QFontMetrics *)aQStack_38);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,WindowText);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->color).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->color = uVar1;
  iVar2 = QTextOption::~QTextOption((QTextOption *)local_30);
  return iVar2;
}

Assistant:

void
TextLabelPrivate::init()
{
	staticText.setTextFormat( Qt::AutoText );

	QTextOption opt;
	opt.setAlignment( Qt::AlignLeft );
	opt.setFlags( QTextOption::IncludeTrailingSpaces );
	opt.setWrapMode( QTextOption::WordWrap );
	staticText.setTextOption( opt );

	staticText.setTextWidth( q->fontMetrics().averageCharWidth() * 10 );

	QSizePolicy sp( QSizePolicy::Preferred, QSizePolicy::Preferred );
	sp.setHeightForWidth( true );
	q->setSizePolicy( sp );

	color = q->palette().color( QPalette::WindowText );
}